

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O2

float __thiscall logloss::getLoss(logloss *this,shared_data *param_1,float prediction,float label)

{
  ostream *poVar1;
  float fVar2;
  
  if (((label != -1.0) || (NAN(label))) && ((label != 1.0 || (NAN(label))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"You are using label ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,label);
    poVar1 = std::operator<<(poVar1," not -1 or 1 as loss function expects!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  fVar2 = expf(-label * prediction);
  fVar2 = logf(fVar2 + 1.0);
  return fVar2;
}

Assistant:

float getLoss(shared_data*, float prediction, float label)
  {
    if (label != -1.f && label != 1.f)
      cout << "You are using label " << label << " not -1 or 1 as loss function expects!" << endl;
    return log(1 + correctedExp(-label * prediction));
  }